

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int StateFireworks(pyhanabi_state_t *state,int color)

{
  const_reference pvVar1;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x167,"int StateFireworks(pyhanabi_state_t *, int)");
  }
  if (state->state != (void *)0x0) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)((long)state->state + 0x80),(long)color
                       );
    return *pvVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x168,"int StateFireworks(pyhanabi_state_t *, int)");
}

Assistant:

int StateFireworks(pyhanabi_state_t* state, int color) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->Fireworks()
      .at(color);
}